

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

void __thiscall Js::SourceTextModuleRecord::InitializeIndirectExports(SourceTextModuleRecord *this)

{
  anon_class_16_2_a283f7e0_for_fn fn;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> **ppSVar1;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *this_00;
  ModuleNameRecord *local_18;
  ModuleNameRecord *exportRecord;
  SourceTextModuleRecord *this_local;
  
  local_18 = (ModuleNameRecord *)0x0;
  exportRecord = (ModuleNameRecord *)this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                      ((WriteBarrierPtr *)&this->indirectExportRecordList);
  if (*ppSVar1 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    this_00 = Memory::
              WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>
              ::operator->(&this->indirectExportRecordList);
    fn.exportRecord = &local_18;
    fn.this = this;
    SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount>::
    Map<Js::SourceTextModuleRecord::InitializeIndirectExports()::__0>
              ((SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount> *)this_00,fn);
  }
  return;
}

Assistant:

void SourceTextModuleRecord::InitializeIndirectExports()
    {
        ModuleNameRecord* exportRecord = nullptr;
        if (indirectExportRecordList != nullptr)
        {
            indirectExportRecordList->Map([&](ModuleImportOrExportEntry exportEntry)
            {
                PropertyId propertyId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateReferenceError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
                if (propertyId != PropertyIds::star_ &&
                    (!childModuleRecord->ResolveExport(propertyId, nullptr, &exportRecord) ||
                    (exportRecord == nullptr)))
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateSyntaxError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_ModuleResolveExport, exportEntry.exportName->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
            });
        }
    }